

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void __thiscall CVmObjTads::build_prop_list(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval)

{
  char *pcVar1;
  CVmObjPageEntry *pCVar2;
  vm_obj_id_t vVar3;
  ulong element_count;
  vm_prop_id_t *pvVar4;
  size_t idx;
  vm_val_t val;
  vm_val_t local_40;
  
  pcVar1 = (this->super_CVmObject).ext_;
  element_count = (ulong)*(ushort *)(pcVar1 + 0x22);
  vVar3 = CVmObjList::create(0,element_count);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar3;
  pCVar2 = G_obj_table_X.pages_[vVar3 >> 0xc];
  pvVar4 = *(vm_prop_id_t **)(pcVar1 + 0x18);
  for (idx = 0; element_count != idx; idx = idx + 1) {
    local_40.val.prop = *pvVar4;
    local_40.typ = VM_PROP;
    CVmObjList::cons_set_element((CVmObjList *)(pCVar2 + (vVar3 & 0xfff)),idx,&local_40);
    pvVar4 = pvVar4 + 0x14;
  }
  **(undefined2 **)((long)&pCVar2[vVar3 & 0xfff].ptr_ + 8) = (short)idx;
  return;
}

Assistant:

void CVmObjTads::build_prop_list(VMG_ vm_obj_id_t self, vm_val_t *retval)
{
    size_t cnt;
    size_t idx;
    CVmObjList *lst;
    vm_tadsobj_prop *entry;
    vm_tadsobj_hdr *hdr = get_hdr();
    
    /* the next free index is also the number of properties we have */
    cnt = hdr->prop_entry_free;

    /* allocate a list big enough for all of our properties */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));

    /* get the list object, property cast */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* add our image file properties to the list */
    for (idx = 0, entry = hdr->prop_entry_arr ; cnt != 0 ;
         --cnt, ++entry)
    {
        /* make a value for this property ID */
        vm_val_t val;
        val.set_propid(entry->prop);

        /* add it to the list */
        lst->cons_set_element(idx++, &val);
    }

    /* set the final length of the list */
    lst->cons_set_len(idx);
}